

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::VertexArrayObjectTestGroup::init
          (VertexArrayObjectTestGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  reference pvVar1;
  VertexArrayObjectTest *pVVar2;
  MultiVertexArrayObjectTest *this_00;
  undefined1 auStack_7a8 [8];
  BufferSpec indexBuffer;
  undefined1 local_758 [8];
  VertexArrayState state_8;
  Spec spec_8;
  undefined1 local_698 [8];
  VertexArrayState state_7;
  Spec spec_7;
  undefined1 local_5d8 [8];
  VertexArrayState state_6;
  Spec spec_6;
  Attribute local_51c;
  undefined1 local_4f8 [8];
  VertexArrayState state_5;
  Spec spec_5;
  undefined1 local_438 [8];
  VertexArrayState state_4;
  Spec spec_4;
  undefined1 local_378 [8];
  VertexArrayState state_3;
  Spec spec_3;
  undefined1 local_2b8 [8];
  VertexArrayState state_2;
  Spec spec_2;
  undefined1 local_1f8 [8];
  VertexArrayState state_1;
  Spec spec_1;
  undefined1 local_130 [8];
  VertexArrayState state;
  Spec spec;
  BufferSpec shortCoordBuffer48;
  undefined1 auStack_68 [8];
  BufferSpec floatCoordBuffer48_2;
  undefined1 auStack_38 [8];
  BufferSpec floatCoordBuffer48_1;
  VertexArrayObjectTestGroup *this_local;
  
  floatCoordBuffer48_1.offset = 0;
  floatCoordBuffer48_1.type = 0;
  auStack_38._0_4_ = 0x30;
  auStack_38._4_4_ = 0x180;
  floatCoordBuffer48_1.count = 2;
  floatCoordBuffer48_1.size = 0;
  floatCoordBuffer48_1.componentCount = 0;
  floatCoordBuffer48_1.stride = 0x1406;
  floatCoordBuffer48_1.intRangeMin = -0x40800000;
  floatCoordBuffer48_1.intRangeMax = 0x3f800000;
  floatCoordBuffer48_2.offset = 0;
  floatCoordBuffer48_2.type = 0;
  auStack_68._0_4_ = 0x30;
  auStack_68._4_4_ = 0x180;
  floatCoordBuffer48_2.count = 2;
  floatCoordBuffer48_2.size = 0;
  floatCoordBuffer48_2.componentCount = 0;
  floatCoordBuffer48_2.stride = 0x1406;
  floatCoordBuffer48_2.intRangeMin = -0x40800000;
  floatCoordBuffer48_2.intRangeMax = 0x3f800000;
  spec.buffers.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xc000000030;
  floatCoordBuffer48_1._32_8_ = this;
  anon_unknown_0::Spec::Spec((Spec *)&state.elementArrayBuffer);
  anon_unknown_0::VertexArrayState::VertexArrayState((VertexArrayState *)local_130);
  anon_unknown_0::Attribute::Attribute
            ((Attribute *)
             &spec_1.buffers.
              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_130,
              (value_type *)
              &spec_1.buffers.
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_130,0);
  pvVar1->enabled = '\x01';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_130,0);
  pvVar1->size = 2;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_130,0);
  pvVar1->stride = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_130,0);
  pvVar1->type = 0x1406;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_130,0);
  pvVar1->integer = '\0';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_130,0);
  pvVar1->divisor = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_130,0);
  pvVar1->offset = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_130,0);
  pvVar1->normalized = '\0';
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)&spec.vao.elementArrayBuffer,(value_type *)auStack_38);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)&spec.vao.elementArrayBuffer,(value_type *)auStack_68);
  spec.count._0_1_ = 0;
  state._28_4_ = 0;
  state.elementArrayBuffer = 0x30;
  anon_unknown_0::VertexArrayState::operator=
            ((VertexArrayState *)&spec.state.elementArrayBuffer,(VertexArrayState *)local_130);
  anon_unknown_0::VertexArrayState::operator=
            ((VertexArrayState *)&spec.indexRangeMax,(VertexArrayState *)local_130);
  spec.useDrawElements = false;
  spec._9_3_ = 0;
  spec.indexType = 0;
  spec.indexOffset = 0;
  spec.instances = 0;
  spec.indexRangeMin = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)&spec.indexRangeMax,0);
  pvVar1->bufferNdx = 1;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)&spec.state.elementArrayBuffer,0);
  pvVar1->bufferNdx = 2;
  pVVar2 = (VertexArrayObjectTest *)operator_new(0x138);
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar2,(this->super_TestCaseGroup).m_context,(Spec *)&state.elementArrayBuffer,
             "diff_buffer","diff_buffer");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pVVar2);
  anon_unknown_0::VertexArrayState::~VertexArrayState((VertexArrayState *)local_130);
  anon_unknown_0::Spec::~Spec((Spec *)&state.elementArrayBuffer);
  anon_unknown_0::Spec::Spec((Spec *)&state_1.elementArrayBuffer);
  anon_unknown_0::VertexArrayState::VertexArrayState((VertexArrayState *)local_1f8);
  anon_unknown_0::Attribute::Attribute
            ((Attribute *)
             ((long)&spec_2.buffers.
                     super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_1f8,
              (value_type *)
              ((long)&spec_2.buffers.
                      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_1f8,0);
  pvVar1->enabled = '\x01';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_1f8,0);
  pvVar1->size = 2;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_1f8,0);
  pvVar1->stride = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_1f8,0);
  pvVar1->type = 0x1406;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_1f8,0);
  pvVar1->integer = '\0';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_1f8,0);
  pvVar1->divisor = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_1f8,0);
  pvVar1->offset = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_1f8,0);
  pvVar1->normalized = '\0';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_1f8,0);
  pvVar1->bufferNdx = 1;
  state_1.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)&spec_1.vao.elementArrayBuffer,(value_type *)auStack_38);
  spec_1.count._0_1_ = 0;
  state_1._28_4_ = 0;
  state_1.elementArrayBuffer = 0x18;
  anon_unknown_0::VertexArrayState::operator=
            ((VertexArrayState *)&spec_1.state.elementArrayBuffer,(VertexArrayState *)local_1f8);
  anon_unknown_0::VertexArrayState::operator=
            ((VertexArrayState *)&spec_1.indexRangeMax,(VertexArrayState *)local_1f8);
  spec_1.useDrawElements = false;
  spec_1._9_3_ = 0;
  spec_1.indexType = 0;
  spec_1.indexOffset = 0;
  spec_1.instances = 0;
  spec_1.indexRangeMin = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)&spec_1.indexRangeMax,0);
  pvVar1->size = 2;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)&spec_1.state.elementArrayBuffer,0);
  pvVar1->size = 3;
  pVVar2 = (VertexArrayObjectTest *)operator_new(0x138);
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar2,(this->super_TestCaseGroup).m_context,(Spec *)&state_1.elementArrayBuffer,
             "diff_size","diff_size");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pVVar2);
  anon_unknown_0::VertexArrayState::~VertexArrayState((VertexArrayState *)local_1f8);
  anon_unknown_0::Spec::~Spec((Spec *)&state_1.elementArrayBuffer);
  anon_unknown_0::Spec::Spec((Spec *)&state_2.elementArrayBuffer);
  anon_unknown_0::VertexArrayState::VertexArrayState((VertexArrayState *)local_2b8);
  anon_unknown_0::Attribute::Attribute
            ((Attribute *)
             ((long)&spec_3.buffers.
                     super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_2b8,
              (value_type *)
              ((long)&spec_3.buffers.
                      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_2b8,0);
  pvVar1->enabled = '\x01';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_2b8,0);
  pvVar1->size = 2;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_2b8,0);
  pvVar1->stride = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_2b8,0);
  pvVar1->type = 0x1402;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_2b8,0);
  pvVar1->integer = '\0';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_2b8,0);
  pvVar1->divisor = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_2b8,0);
  pvVar1->offset = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_2b8,0);
  pvVar1->normalized = '\x01';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_2b8,0);
  pvVar1->bufferNdx = 1;
  state_2.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)&spec_2.vao.elementArrayBuffer,
              (value_type *)
              &spec.buffers.
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  spec_2.count._0_1_ = 0;
  state_2._28_4_ = 0;
  state_2.elementArrayBuffer = 0x18;
  anon_unknown_0::VertexArrayState::operator=
            ((VertexArrayState *)&spec_2.state.elementArrayBuffer,(VertexArrayState *)local_2b8);
  anon_unknown_0::VertexArrayState::operator=
            ((VertexArrayState *)&spec_2.indexRangeMax,(VertexArrayState *)local_2b8);
  spec_2.useDrawElements = false;
  spec_2._9_3_ = 0;
  spec_2.indexType = 0;
  spec_2.indexOffset = 0;
  spec_2.instances = 0;
  spec_2.indexRangeMin = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)&spec_2.state.elementArrayBuffer,0);
  pvVar1->stride = 2;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)&spec_2.indexRangeMax,0);
  pvVar1->stride = 4;
  pVVar2 = (VertexArrayObjectTest *)operator_new(0x138);
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar2,(this->super_TestCaseGroup).m_context,(Spec *)&state_2.elementArrayBuffer,
             "diff_stride","diff_stride");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pVVar2);
  anon_unknown_0::VertexArrayState::~VertexArrayState((VertexArrayState *)local_2b8);
  anon_unknown_0::Spec::~Spec((Spec *)&state_2.elementArrayBuffer);
  anon_unknown_0::Spec::Spec((Spec *)&state_3.elementArrayBuffer);
  anon_unknown_0::VertexArrayState::VertexArrayState((VertexArrayState *)local_378);
  anon_unknown_0::Attribute::Attribute
            ((Attribute *)
             ((long)&spec_4.buffers.
                     super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_378,
              (value_type *)
              ((long)&spec_4.buffers.
                      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_378,0);
  pvVar1->enabled = '\x01';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_378,0);
  pvVar1->size = 2;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_378,0);
  pvVar1->stride = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_378,0);
  pvVar1->type = 0x1402;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_378,0);
  pvVar1->integer = '\0';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_378,0);
  pvVar1->divisor = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_378,0);
  pvVar1->offset = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_378,0);
  pvVar1->normalized = '\x01';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_378,0);
  pvVar1->bufferNdx = 1;
  state_3.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)&spec_3.vao.elementArrayBuffer,
              (value_type *)
              &spec.buffers.
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  spec_3.count._0_1_ = 0;
  state_3._28_4_ = 0;
  state_3.elementArrayBuffer = 0x18;
  anon_unknown_0::VertexArrayState::operator=
            ((VertexArrayState *)&spec_3.state.elementArrayBuffer,(VertexArrayState *)local_378);
  anon_unknown_0::VertexArrayState::operator=
            ((VertexArrayState *)&spec_3.indexRangeMax,(VertexArrayState *)local_378);
  spec_3.useDrawElements = false;
  spec_3._9_3_ = 0;
  spec_3.indexType = 0;
  spec_3.indexOffset = 0;
  spec_3.instances = 0;
  spec_3.indexRangeMin = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)&spec_3.state.elementArrayBuffer,0);
  pvVar1->type = 0x1402;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)&spec_3.indexRangeMax,0);
  pvVar1->type = 0x1400;
  pVVar2 = (VertexArrayObjectTest *)operator_new(0x138);
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar2,(this->super_TestCaseGroup).m_context,(Spec *)&state_3.elementArrayBuffer,
             "diff_type","diff_type");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pVVar2);
  anon_unknown_0::VertexArrayState::~VertexArrayState((VertexArrayState *)local_378);
  anon_unknown_0::Spec::~Spec((Spec *)&state_3.elementArrayBuffer);
  anon_unknown_0::Spec::Spec((Spec *)&state_4.elementArrayBuffer);
  anon_unknown_0::VertexArrayState::VertexArrayState((VertexArrayState *)local_438);
  anon_unknown_0::Attribute::Attribute
            ((Attribute *)
             ((long)&spec_5.buffers.
                     super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_438,
              (value_type *)
              ((long)&spec_5.buffers.
                      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_438,0);
  pvVar1->enabled = '\x01';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_438,0);
  pvVar1->size = 2;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_438,0);
  pvVar1->stride = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_438,0);
  pvVar1->type = 0x1400;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_438,0);
  pvVar1->integer = '\x01';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_438,0);
  pvVar1->divisor = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_438,0);
  pvVar1->offset = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_438,0);
  pvVar1->normalized = '\0';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_438,0);
  pvVar1->bufferNdx = 1;
  state_4.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)&spec_4.vao.elementArrayBuffer,
              (value_type *)
              &spec.buffers.
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  spec_4.count._0_1_ = 0;
  state_4.elementArrayBuffer = 0x18;
  anon_unknown_0::VertexArrayState::operator=
            ((VertexArrayState *)&spec_4.state.elementArrayBuffer,(VertexArrayState *)local_438);
  anon_unknown_0::VertexArrayState::operator=
            ((VertexArrayState *)&spec_4.indexRangeMax,(VertexArrayState *)local_438);
  state_4._28_4_ = 0;
  spec_4.useDrawElements = false;
  spec_4._9_3_ = 0;
  spec_4.indexType = 0;
  spec_4.indexOffset = 0;
  spec_4.instances = 0;
  spec_4.indexRangeMin = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)&spec_4.indexRangeMax,0);
  pvVar1->integer = '\0';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)&spec_4.state.elementArrayBuffer,0);
  pvVar1->integer = '\x01';
  pVVar2 = (VertexArrayObjectTest *)operator_new(0x138);
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar2,(this->super_TestCaseGroup).m_context,(Spec *)&state_4.elementArrayBuffer,
             "diff_integer","diff_integer");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pVVar2);
  anon_unknown_0::VertexArrayState::~VertexArrayState((VertexArrayState *)local_438);
  anon_unknown_0::Spec::~Spec((Spec *)&state_4.elementArrayBuffer);
  anon_unknown_0::Spec::Spec((Spec *)&state_5.elementArrayBuffer);
  anon_unknown_0::VertexArrayState::VertexArrayState((VertexArrayState *)local_4f8);
  anon_unknown_0::Attribute::Attribute(&local_51c);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_4f8,&local_51c);
  anon_unknown_0::Attribute::Attribute
            ((Attribute *)
             &spec_6.buffers.
              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_4f8,
              (value_type *)
              &spec_6.buffers.
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_4f8,0);
  pvVar1->enabled = '\x01';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_4f8,0);
  pvVar1->size = 2;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_4f8,0);
  pvVar1->stride = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_4f8,0);
  pvVar1->type = 0x1402;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_4f8,0);
  pvVar1->integer = '\0';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_4f8,0);
  pvVar1->divisor = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_4f8,0);
  pvVar1->offset = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_4f8,0);
  pvVar1->normalized = '\x01';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_4f8,0);
  pvVar1->bufferNdx = 1;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_4f8,1);
  pvVar1->enabled = '\x01';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_4f8,1);
  pvVar1->size = 4;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_4f8,1);
  pvVar1->stride = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_4f8,1);
  pvVar1->type = 0x1406;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_4f8,1);
  pvVar1->integer = '\0';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_4f8,1);
  pvVar1->divisor = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_4f8,1);
  pvVar1->offset = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_4f8,1);
  pvVar1->normalized = '\0';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_4f8,1);
  pvVar1->bufferNdx = 2;
  state_5.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)&spec_5.vao.elementArrayBuffer,
              (value_type *)
              &spec.buffers.
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)&spec_5.vao.elementArrayBuffer,(value_type *)auStack_38);
  spec_5.count._0_1_ = 0;
  state_5._28_4_ = 10;
  state_5.elementArrayBuffer = 0xc;
  anon_unknown_0::VertexArrayState::operator=
            ((VertexArrayState *)&spec_5.state.elementArrayBuffer,(VertexArrayState *)local_4f8);
  anon_unknown_0::VertexArrayState::operator=
            ((VertexArrayState *)&spec_5.indexRangeMax,(VertexArrayState *)local_4f8);
  spec_5.useDrawElements = false;
  spec_5._9_3_ = 0;
  spec_5.indexType = 0;
  spec_5.indexOffset = 0;
  spec_5.instances = 0;
  spec_5.indexRangeMin = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)&spec_5.state.elementArrayBuffer,1);
  pvVar1->divisor = 3;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)&spec_5.indexRangeMax,1);
  pvVar1->divisor = 2;
  pVVar2 = (VertexArrayObjectTest *)operator_new(0x138);
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar2,(this->super_TestCaseGroup).m_context,(Spec *)&state_5.elementArrayBuffer,
             "diff_divisor","diff_divisor");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pVVar2);
  anon_unknown_0::VertexArrayState::~VertexArrayState((VertexArrayState *)local_4f8);
  anon_unknown_0::Spec::~Spec((Spec *)&state_5.elementArrayBuffer);
  anon_unknown_0::Spec::Spec((Spec *)&state_6.elementArrayBuffer);
  anon_unknown_0::VertexArrayState::VertexArrayState((VertexArrayState *)local_5d8);
  anon_unknown_0::Attribute::Attribute
            ((Attribute *)
             ((long)&spec_7.buffers.
                     super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_5d8,
              (value_type *)
              ((long)&spec_7.buffers.
                      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_5d8,0);
  pvVar1->enabled = '\x01';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_5d8,0);
  pvVar1->size = 2;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_5d8,0);
  pvVar1->stride = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_5d8,0);
  pvVar1->type = 0x1402;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_5d8,0);
  pvVar1->integer = '\0';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_5d8,0);
  pvVar1->divisor = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_5d8,0);
  pvVar1->offset = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_5d8,0);
  pvVar1->normalized = '\x01';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_5d8,0);
  pvVar1->bufferNdx = 1;
  state_6.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)&spec_6.vao.elementArrayBuffer,
              (value_type *)
              &spec.buffers.
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  spec_6.count._0_1_ = 0;
  state_6._28_4_ = 0;
  state_6.elementArrayBuffer = 0x18;
  anon_unknown_0::VertexArrayState::operator=
            ((VertexArrayState *)&spec_6.state.elementArrayBuffer,(VertexArrayState *)local_5d8);
  anon_unknown_0::VertexArrayState::operator=
            ((VertexArrayState *)&spec_6.indexRangeMax,(VertexArrayState *)local_5d8);
  spec_6.useDrawElements = false;
  spec_6._9_3_ = 0;
  spec_6.indexType = 0;
  spec_6.indexOffset = 0;
  spec_6.instances = 0;
  spec_6.indexRangeMin = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)&spec_6.state.elementArrayBuffer,0);
  pvVar1->offset = 2;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)&spec_6.indexRangeMax,0);
  pvVar1->offset = 4;
  pVVar2 = (VertexArrayObjectTest *)operator_new(0x138);
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar2,(this->super_TestCaseGroup).m_context,(Spec *)&state_6.elementArrayBuffer,
             "diff_offset","diff_offset");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pVVar2);
  anon_unknown_0::VertexArrayState::~VertexArrayState((VertexArrayState *)local_5d8);
  anon_unknown_0::Spec::~Spec((Spec *)&state_6.elementArrayBuffer);
  anon_unknown_0::Spec::Spec((Spec *)&state_7.elementArrayBuffer);
  anon_unknown_0::VertexArrayState::VertexArrayState((VertexArrayState *)local_698);
  anon_unknown_0::Attribute::Attribute
            ((Attribute *)
             ((long)&spec_8.buffers.
                     super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_698,
              (value_type *)
              ((long)&spec_8.buffers.
                      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_698,0);
  pvVar1->enabled = '\x01';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_698,0);
  pvVar1->size = 2;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_698,0);
  pvVar1->stride = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_698,0);
  pvVar1->type = 0x1402;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_698,0);
  pvVar1->integer = '\0';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_698,0);
  pvVar1->divisor = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_698,0);
  pvVar1->offset = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_698,0);
  pvVar1->normalized = '\x01';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_698,0);
  pvVar1->bufferNdx = 1;
  state_7.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)&spec_7.vao.elementArrayBuffer,
              (value_type *)
              &spec.buffers.
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  spec_7.count._0_1_ = 0;
  state_7._28_4_ = 0;
  state_7.elementArrayBuffer = 0x30;
  anon_unknown_0::VertexArrayState::operator=
            ((VertexArrayState *)&spec_7.state.elementArrayBuffer,(VertexArrayState *)local_698);
  anon_unknown_0::VertexArrayState::operator=
            ((VertexArrayState *)&spec_7.indexRangeMax,(VertexArrayState *)local_698);
  spec_7.useDrawElements = false;
  spec_7._9_3_ = 0;
  spec_7.indexType = 0;
  spec_7.indexOffset = 0;
  spec_7.instances = 0;
  spec_7.indexRangeMin = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)&spec_7.state.elementArrayBuffer,0);
  pvVar1->normalized = '\x01';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)&spec_7.indexRangeMax,0);
  pvVar1->normalized = '\0';
  pVVar2 = (VertexArrayObjectTest *)operator_new(0x138);
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar2,(this->super_TestCaseGroup).m_context,(Spec *)&state_7.elementArrayBuffer,
             "diff_normalize","diff_normalize");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pVVar2);
  anon_unknown_0::VertexArrayState::~VertexArrayState((VertexArrayState *)local_698);
  anon_unknown_0::Spec::~Spec((Spec *)&state_7.elementArrayBuffer);
  anon_unknown_0::Spec::Spec((Spec *)&state_8.elementArrayBuffer);
  anon_unknown_0::VertexArrayState::VertexArrayState((VertexArrayState *)local_758);
  anon_unknown_0::Attribute::Attribute((Attribute *)&indexBuffer.floatRangeMax);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_758,(value_type *)&indexBuffer.floatRangeMax);
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_758,0);
  pvVar1->enabled = '\x01';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_758,0);
  pvVar1->size = 2;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_758,0);
  pvVar1->stride = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_758,0);
  pvVar1->type = 0x1406;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_758,0);
  pvVar1->integer = '\0';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_758,0);
  pvVar1->divisor = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_758,0);
  pvVar1->offset = 0;
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_758,0);
  pvVar1->normalized = '\x01';
  pvVar1 = std::
           vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                         *)local_758,0);
  pvVar1->bufferNdx = 1;
  state_8.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)&spec_8.vao.elementArrayBuffer,(value_type *)auStack_38);
  indexBuffer.intRangeMin = 0;
  indexBuffer.intRangeMax = 0;
  auStack_7a8._0_4_ = 0x18;
  auStack_7a8._4_4_ = 0xc0;
  indexBuffer.count = 1;
  indexBuffer.size = 0;
  indexBuffer.componentCount = 0;
  indexBuffer.stride = 0x1403;
  indexBuffer.offset = 0;
  indexBuffer.type = 0x30;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)&spec_8.vao.elementArrayBuffer,(value_type *)auStack_7a8);
  spec_8.count._0_1_ = 1;
  state_8.elementArrayBuffer = 0x18;
  anon_unknown_0::VertexArrayState::operator=
            ((VertexArrayState *)&spec_8.state.elementArrayBuffer,(VertexArrayState *)local_758);
  anon_unknown_0::VertexArrayState::operator=
            ((VertexArrayState *)&spec_8.indexRangeMax,(VertexArrayState *)local_758);
  state_8._28_4_ = 0;
  spec_8.useDrawElements = false;
  spec_8._9_3_ = 0;
  spec_8.indexType = 0;
  spec_8.indexOffset = 0x30;
  spec_8.instances = 0x1403;
  spec_8.indexRangeMin = 0x18;
  spec_8.state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  spec_8.vao.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
  pVVar2 = (VertexArrayObjectTest *)operator_new(0x138);
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar2,(this->super_TestCaseGroup).m_context,(Spec *)&state_8.elementArrayBuffer,
             "diff_indices","diff_indices");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pVVar2);
  anon_unknown_0::VertexArrayState::~VertexArrayState((VertexArrayState *)local_758);
  anon_unknown_0::Spec::~Spec((Spec *)&state_8.elementArrayBuffer);
  this_00 = (MultiVertexArrayObjectTest *)operator_new(0x138);
  MultiVertexArrayObjectTest::MultiVertexArrayObjectTest
            (this_00,(this->super_TestCaseGroup).m_context,"all_attributes","all_attributes");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  return extraout_EAX;
}

Assistant:

void VertexArrayObjectTestGroup::init (void)
{
	BufferSpec floatCoordBuffer48_1 = { 48, 384, 2, 0, 0, GL_FLOAT, 0, 0, -1.0f, 1.0f };
	BufferSpec floatCoordBuffer48_2 = { 48, 384, 2, 0, 0, GL_FLOAT, 0, 0, -1.0f, 1.0f };

	BufferSpec shortCoordBuffer48 = { 48, 192, 2, 0, 0, GL_SHORT, -32768, 32768, 0.0f, 0.0f };

	// Different buffer
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_FLOAT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_FALSE;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(floatCoordBuffer48_1);
		spec.buffers.push_back(floatCoordBuffer48_2);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 48;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.state.attributes[0].bufferNdx	= 1;
		spec.vao.attributes[0].bufferNdx	= 2;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_buffer", "diff_buffer"));
	}
	// Different size
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_FLOAT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_FALSE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(floatCoordBuffer48_1);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.state.attributes[0].size		= 2;
		spec.vao.attributes[0].size			= 3;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_size", "diff_size"));
	}

	// Different stride
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[0].stride	= 2;
		spec.state.attributes[0].stride	= 4;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_stride", "diff_stride"));
	}

	// Different types
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[0].type		= GL_SHORT;
		spec.state.attributes[0].type	= GL_BYTE;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_type", "diff_type"));
	}
	// Different "integer"
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_BYTE;
		state.attributes[0].integer		= GL_TRUE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_FALSE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.instances			= 0;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.state.attributes[0].integer	= GL_FALSE;
		spec.vao.attributes[0].integer		= GL_TRUE;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_integer", "diff_integer"));
	}
	// Different divisor
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());
		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.attributes[1].enabled		= true;
		state.attributes[1].size		= 4;
		state.attributes[1].stride		= 0;
		state.attributes[1].type		= GL_FLOAT;
		state.attributes[1].integer		= GL_FALSE;
		state.attributes[1].divisor		= 0;
		state.attributes[1].offset		= 0;
		state.attributes[1].normalized	= GL_FALSE;
		state.attributes[1].bufferNdx	= 2;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);
		spec.buffers.push_back(floatCoordBuffer48_1);

		spec.useDrawElements	= false;
		spec.instances			= 10;
		spec.count				= 12;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[1].divisor		= 3;
		spec.state.attributes[1].divisor	= 2;

		addChild(new VertexArrayObjectTest(m_context, spec, "diff_divisor", "diff_divisor"));
	}
	// Different offset
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[0].offset	= 2;
		spec.state.attributes[0].offset	= 4;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_offset", "diff_offset"));
	}
	// Different normalize
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 48;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[0].normalized	= GL_TRUE;
		spec.state.attributes[0].normalized	= GL_FALSE;;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_normalize", "diff_normalize"));
	}
	// DrawElements with buffer / Pointer
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_FLOAT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(floatCoordBuffer48_1);

		BufferSpec indexBuffer = { 24, 192, 1, 0, 0, GL_UNSIGNED_SHORT, 0, 48, 0.0f, 0.0f };
		spec.buffers.push_back(indexBuffer);

		spec.useDrawElements	= true;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.instances			= 0;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 48;
		spec.indexType			= GL_UNSIGNED_SHORT;
		spec.indexCount			= 24;

		spec.state.elementArrayBuffer	= 0;
		spec.vao.elementArrayBuffer		= 2;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_indices", "diff_indices"));
	}
	// Use all attributes

	addChild(new MultiVertexArrayObjectTest(m_context, "all_attributes", "all_attributes"));
}